

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.h
# Opt level: O3

void __thiscall
OpenMPDeclareVariantDirective::setVariantFuncID
          (OpenMPDeclareVariantDirective *this,char *_variant_func_id)

{
  allocator<char> local_31;
  long *local_30 [2];
  long local_20 [2];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,_variant_func_id,&local_31);
  std::__cxx11::string::operator=((string *)&this->variant_func_id,(string *)local_30);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return;
}

Assistant:

void setVariantFuncID (const char* _variant_func_id) { variant_func_id = std::string(_variant_func_id); }